

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LazyLocalGraph::computeGetInfluences(LazyLocalGraph *this)

{
  if ((this->getInfluences).
      super__Optional_base<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>_>
      ._M_engaged == true) {
    __assert_fail("!getInfluences",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                  ,0x2b6,"void wasm::LazyLocalGraph::computeGetInfluences() const");
  }
  getLocations(this);
  if ((this->locations).
      super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
      ._M_engaged != false) {
    std::
    optional<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>_>
    ::emplace<>(&this->getInfluences);
    doComputeGetInfluences((Locations *)&this->locations,(GetInfluencesMap *)&this->getInfluences);
    return;
  }
  __assert_fail("locations",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,699,"void wasm::LazyLocalGraph::computeGetInfluences() const");
}

Assistant:

void LazyLocalGraph::computeGetInfluences() const {
  // We must never repeat work.
  assert(!getInfluences);

  // We do not need any flow for this, but we do need |locations| to be filled
  // in.
  getLocations();
  assert(locations);

  getInfluences.emplace();
  doComputeGetInfluences(*locations, *getInfluences);
}